

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::mouseReleaseEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  bool bVar1;
  char cVar2;
  QPoint p;
  QAction *this_01;
  QMenu *pQVar3;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) == 0) {
    bVar1 = QMenuPrivate::mouseEventTaken(this_00,e);
    pQVar3 = QMenuPrivate::mouseDown;
    if ((!bVar1) && (QMenuPrivate::mouseDown = (QMenu *)0x0, pQVar3 == this)) {
      QMenuPrivate::setSyncAction(this_00);
      local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      local_28 = QPointF::toPoint(&local_38);
      bVar1 = QMenuPrivate::hasMouseMoved(this_00,&local_28);
      if (bVar1) {
        local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
        p = QPointF::toPoint(&local_38);
        this_01 = QMenuPrivate::actionAt(this_00,p);
        if (this_01 != (QAction *)0x0) {
          if (this_01 == this_00->currentAction) {
            pQVar3 = QAction::menu<QMenu*>(this_01);
            if (pQVar3 == (QMenu *)0x0) {
              QMenuPrivate::activateAction(this_00,this_01,Trigger,true);
            }
            goto LAB_004258d0;
          }
          cVar2 = QAction::isEnabled();
          if (cVar2 == '\0') goto LAB_004258d0;
        }
      }
      QMenuPrivate::hideUpToMenuBar(this_00);
    }
  }
LAB_004258d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    if (QMenuPrivate::mouseDown != this) {
        QMenuPrivate::mouseDown = nullptr;
        return;
    }

    QMenuPrivate::mouseDown = nullptr;
    d->setSyncAction();

    if (!d->hasMouseMoved(e->globalPosition().toPoint())) {
        // We don't want to trigger a menu item if the mouse hasn't moved
        // since the popup was opened. Instead we want to close the menu.
        d->hideUpToMenuBar();
        return;
    }

    QAction *action = d->actionAt(e->position().toPoint());
    if (action && action == d->currentAction) {
        if (!action->menu()) {
#if defined(Q_OS_WIN)
            //On Windows only context menus can be activated with the right button
            if (e->button() == Qt::LeftButton || d->topCausedWidget() == 0)
#endif
                d->activateAction(action, QAction::Trigger);
        }
    } else if (!action || action->isEnabled()) {
        d->hideUpToMenuBar();
    }
}